

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.h
# Opt level: O0

void __thiscall
flow::TargetCodeGenerator::emitInstr(TargetCodeGenerator *this,Opcode opc,Operand op1,Operand op2)

{
  Instruction instr;
  Operand op2_local;
  Operand op1_local;
  Opcode opc_local;
  TargetCodeGenerator *this_local;
  
  instr = makeInstruction(opc,op1,op2);
  emitInstr(this,instr);
  return;
}

Assistant:

void emitInstr(Opcode opc, Operand op1, Operand op2) {
    emitInstr(makeInstruction(opc, op1, op2));
  }